

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentNormalizer.cc
# Opt level: O0

void __thiscall ContentNormalizer::handleToken(ContentNormalizer *this,Token *token)

{
  int iVar1;
  char *pcVar2;
  string *psVar3;
  long lVar4;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  allocator<char> local_119;
  string local_118 [32];
  string *local_f8;
  string *value;
  QPDFObjectHandle local_d0;
  string local_c0;
  allocator<char> local_99;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [32];
  size_type local_40;
  size_type r_pos;
  size_t pos;
  size_type size;
  string *value_1;
  Token *pTStack_18;
  token_type_e token_type;
  Token *token_local;
  ContentNormalizer *this_local;
  
  pTStack_18 = token;
  token_local = (Token *)this;
  value_1._4_4_ = QPDFTokenizer::Token::getType(token);
  if (value_1._4_4_ == tt_bad) {
    this->any_bad_tokens = true;
    this->last_token_was_bad = true;
  }
  else if (value_1._4_4_ != tt_eof) {
    this->last_token_was_bad = false;
  }
  if (value_1._4_4_ == tt_name) {
    psVar3 = QPDFTokenizer::Token::getValue_abi_cxx11_(pTStack_18);
    ::qpdf::Name::normalize((string *)&value,psVar3);
    QPDFObjectHandle::TokenFilter::write
              (&this->super_TokenFilter,(int)(string *)&value,__buf_02,in_RCX);
    std::__cxx11::string::~string((string *)&value);
  }
  else {
    if (value_1._4_4_ != tt_string) {
      if (value_1._4_4_ != tt_space) {
        QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,pTStack_18);
        return;
      }
      size = (size_type)QPDFTokenizer::Token::getRawValue_abi_cxx11_(pTStack_18);
      pos = std::__cxx11::string::size();
      r_pos = 0;
      local_40 = std::__cxx11::string::find((char)size,0xd);
      while( true ) {
        if (local_40 == 0xffffffffffffffff) {
          if (pos <= r_pos) {
            return;
          }
          iVar1 = std::__cxx11::string::operator[](size);
          QPDFObjectHandle::TokenFilter::write
                    (&this->super_TokenFilter,iVar1,(void *)(pos - r_pos),in_RCX);
          return;
        }
        if (r_pos != local_40) {
          iVar1 = std::__cxx11::string::operator[](size);
          QPDFObjectHandle::TokenFilter::write
                    (&this->super_TokenFilter,iVar1,(void *)(local_40 - r_pos),in_RCX);
        }
        local_40 = local_40 + 1;
        if (pos <= local_40) break;
        pcVar2 = (char *)std::__cxx11::string::operator[](size);
        if (*pcVar2 != '\n') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_98,"\n",&local_99);
          QPDFObjectHandle::TokenFilter::write
                    (&this->super_TokenFilter,(int)local_98,__buf_00,in_RCX);
          std::__cxx11::string::~string(local_98);
          std::allocator<char>::~allocator(&local_99);
        }
        r_pos = local_40;
        local_40 = std::__cxx11::string::find((char)size,0xd);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_60,"\n",&local_61);
      QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)local_60,__buf,in_RCX);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
      return;
    }
    psVar3 = QPDFTokenizer::Token::getValue_abi_cxx11_(pTStack_18);
    QPDFObjectHandle::newString(&local_d0,psVar3);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_c0,&local_d0);
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_c0,__buf_01,in_RCX);
    std::__cxx11::string::~string((string *)&local_c0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
  }
  local_f8 = QPDFTokenizer::Token::getRawValue_abi_cxx11_(pTStack_18);
  lVar4 = std::__cxx11::string::find((char)local_f8,0xd);
  if ((lVar4 != -1) || (lVar4 = std::__cxx11::string::find((char)local_f8,10), lVar4 != -1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_118,"\n",&local_119);
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)local_118,__buf_03,in_RCX);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  return;
}

Assistant:

void
ContentNormalizer::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e token_type = token.getType();

    if (token_type == QPDFTokenizer::tt_bad) {
        this->any_bad_tokens = true;
        this->last_token_was_bad = true;
    } else if (token_type != QPDFTokenizer::tt_eof) {
        this->last_token_was_bad = false;
    }

    switch (token_type) {
    case QPDFTokenizer::tt_space:
        {
            std::string const& value = token.getRawValue();
            auto size = value.size();
            size_t pos = 0;
            auto r_pos = value.find('\r');
            while (r_pos != std::string::npos) {
                if (pos != r_pos) {
                    write(&value[pos], r_pos - pos);
                }
                if (++r_pos >= size) {
                    write("\n");
                    return;
                }
                if (value[r_pos] != '\n') {
                    write("\n");
                }
                pos = r_pos;
                r_pos = value.find('\r', pos);
            }
            if (pos < size) {
                write(&value[pos], size - pos);
            }
        }
        return;

    case QPDFTokenizer::tt_string:
        // Replacing string and name tokens in this way normalizes their representation as this will
        // automatically handle quoting of unprintable characters, etc.
        write(QPDFObjectHandle::newString(token.getValue()).unparse());
        break;

    case QPDFTokenizer::tt_name:
        write(Name::normalize(token.getValue()));
        break;

    default:
        writeToken(token);
        return;
    }

    // tt_string or tt_name
    std::string const& value = token.getRawValue();
    if (value.find('\r') != std::string::npos || value.find('\n') != std::string::npos) {
        write("\n");
    }
}